

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_clear_bindings(sqlite3_stmt *pStmt)

{
  sqlite3_mutex *p_00;
  sqlite3_mutex *mutex;
  Vdbe *p;
  int rc;
  int i;
  sqlite3_stmt *pStmt_local;
  
  p_00 = *(sqlite3_mutex **)(*(long *)pStmt + 0x18);
  sqlite3_mutex_enter(p_00);
  for (p._4_4_ = 0; p._4_4_ < *(short *)(pStmt + 0x88); p._4_4_ = p._4_4_ + 1) {
    sqlite3VdbeMemRelease((Mem *)(*(long *)(pStmt + 0x78) + (long)p._4_4_ * 0x38));
    *(undefined2 *)(*(long *)(pStmt + 0x78) + (long)p._4_4_ * 0x38 + 0x24) = 1;
  }
  if (((*(ushort *)(pStmt + 0x9a) >> 9 & 1) != 0) && (*(int *)(pStmt + 0xf4) != 0)) {
    *(ushort *)(pStmt + 0x9a) = *(ushort *)(pStmt + 0x9a) & 0xffdf | 0x20;
  }
  sqlite3_mutex_leave(p_00);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_clear_bindings(sqlite3_stmt *pStmt){
  int i;
  int rc = SQLITE_OK;
  Vdbe *p = (Vdbe*)pStmt;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = ((Vdbe*)pStmt)->db->mutex;
#endif
  sqlite3_mutex_enter(mutex);
  for(i=0; i<p->nVar; i++){
    sqlite3VdbeMemRelease(&p->aVar[i]);
    p->aVar[i].flags = MEM_Null;
  }
  if( p->isPrepareV2 && p->expmask ){
    p->expired = 1;
  }
  sqlite3_mutex_leave(mutex);
  return rc;
}